

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O0

uintptr_t next_target_addr(uintptr_t current,uintptr_t start,uintptr_t end,size_t len,int pattern)

{
  int iVar1;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  undefined4 in_R8D;
  ulong local_48;
  ulong local_40;
  ulong local_8;
  
  switch(in_R8D) {
  case 0:
    local_40 = in_RSI;
    if (in_RDI + in_RCX <= in_RDX) {
      local_40 = in_RDI + in_RCX;
    }
    local_8 = local_40;
    break;
  case 1:
    local_48 = in_RSI;
    if (in_RDI + 0x200 <= in_RDX) {
      local_48 = in_RDI + 0x200;
    }
    local_8 = local_48;
    break;
  case 2:
    local_8 = in_RDI;
    break;
  case 3:
    iVar1 = rand();
    local_8 = (ulong)(long)iVar1 % ((in_RDX - in_RSI) - in_RCX) + in_RSI & 0xfffffffffffff000;
    break;
  default:
    fprintf(_stderr,"%s:ERR: invalid access pattern\n","next_target_addr");
    exit(1);
  }
  return local_8;
}

Assistant:

uintptr_t next_target_addr(uintptr_t current, uintptr_t start, uintptr_t end,
			   size_t len, int pattern)
{
	/*
	 * @current: current target address
	 * @start: start of region
	 * @end: end of region
	 * @len: dma length
	 * @int: access pattern
	 */

	switch (pattern) {

	case DMA_PATTERN_SEQ:
		return (current + len > end) ? start : current + len;

	case DMA_PATTERN_SEQ512:
		return (current + 512 > end) ? start : current + 512;

	case DMA_PATTERN_FIX:
		return current;

	case DMA_PATTERN_RANDOM:
		return (((rand() % (end - start - len)) + start) >> 12) << 12;

	default:
		pr_err("invalid access pattern\n");
		exit(1);
	}
	
	/* not reached */
	return 0;
}